

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

void If_ManImproveMark_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  if ((*(uint *)pObj >> 8 & 1) == 0) {
    if ((*(uint *)pObj & 0xf) != 4) {
      __assert_fail("If_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                    ,0xba,"void If_ManImproveMark_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
    }
    If_ManImproveMark_rec(p,pObj->pFanin0,vVisited);
    If_ManImproveMark_rec(p,pObj->pFanin1,vVisited);
    Vec_PtrPush(vVisited,pObj);
    pObj->field_0x1 = pObj->field_0x1 | 1;
  }
  return;
}

Assistant:

void If_ManImproveMark_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( pObj->fMark )
        return;
    assert( If_ObjIsAnd(pObj) );
    If_ManImproveMark_rec( p, If_ObjFanin0(pObj), vVisited );
    If_ManImproveMark_rec( p, If_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
    pObj->fMark = 1;
}